

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

int countLaunches(node *root,bool postorderTraversal)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  node *pnVar5;
  size_type sVar6;
  _Elt_pointer ppnVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000031;
  long lVar12;
  ulong uVar13;
  vector<int,_std::allocator<int>_> gridStartOp;
  vector<int,_std::allocator<int>_> operationsTmp;
  deque<node_*,_std::allocator<node_*>_> S;
  allocator_type local_b1;
  _Vector_base<int,_std::allocator<int>_> local_b0;
  _Vector_base<int,_std::allocator<int>_> local_98;
  _Deque_base<node_*,_std::allocator<node_*>_> local_80;
  
  std::_Deque_base<node_*,_std::allocator<node_*>_>::_Deque_base(&local_80);
  if ((int)CONCAT71(in_register_00000031,postorderTraversal) == 0) {
    reverseLevelOrder(root,(deque<node_*,_std::allocator<node_*>_> *)&local_80);
  }
  else {
    traversePostorder(root,(deque<node_*,_std::allocator<node_*>_> *)&local_80);
  }
  sVar6 = std::deque<node_*,_std::allocator<node_*>_>::size
                    ((deque<node_*,_std::allocator<node_*>_> *)&local_80);
  uVar8 = (uint)sVar6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_b0,(long)(int)uVar8,
             (allocator_type *)&local_98);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_98,(long)(int)uVar8,&local_b1);
  uVar13 = 0;
  iVar11 = 0;
  iVar9 = 0;
  do {
    if (uVar13 == (~((int)uVar8 >> 0x1f) & uVar8)) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b0);
      std::_Deque_base<node_*,_std::allocator<node_*>_>::~_Deque_base(&local_80);
      return iVar9;
    }
    ppnVar7 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppnVar7 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pnVar5 = ppnVar7[-1];
    std::deque<node_*,_std::allocator<node_*>_>::pop_back
              ((deque<node_*,_std::allocator<node_*>_> *)&local_80);
    iVar2 = pnVar5->data;
    iVar3 = pnVar5->left->data;
    iVar4 = pnVar5->right->data;
    local_98._M_impl.super__Vector_impl_data._M_start[uVar13] = iVar2;
    if (uVar13 == 0) {
LAB_00107d66:
      iVar10 = iVar9 + 1;
      local_b0._M_impl.super__Vector_impl_data._M_start[iVar9] = (int)uVar13;
      iVar11 = iVar2;
    }
    else {
      iVar10 = iVar9;
      if (iVar11 <= iVar3 || iVar11 <= iVar4) {
        lVar12 = (long)local_b0._M_impl.super__Vector_impl_data._M_start[(long)iVar9 + -1];
        do {
          if ((long)uVar13 <= lVar12) goto LAB_00107d6e;
          piVar1 = local_98._M_impl.super__Vector_impl_data._M_start + lVar12;
        } while ((iVar3 != *piVar1) && (lVar12 = lVar12 + 1, iVar4 != *piVar1));
        goto LAB_00107d66;
      }
    }
LAB_00107d6e:
    if (iVar2 < iVar11) {
      iVar11 = iVar2;
    }
    uVar13 = uVar13 + 1;
    iVar9 = iVar10;
  } while( true );
}

Assistant:

int countLaunches(node* root, bool postorderTraversal)
{
    std::deque <node *> S;
    if (postorderTraversal == true) {
        traversePostorder(root, S);
    } else {
        reverseLevelOrder(root, S);
    }

    int opCount = S.size();

    int launchCount = 0;
    std::vector<int> gridStartOp(opCount);
    std::vector<int> operationsTmp(opCount);
    int parentMinIndex = 0;

    for(int op=0; op<opCount; op++){
        node* parent = S.back();
        S.pop_back();
        int parentIndex = parent->data;
        int child1Index = parent->left->data;
        int child2Index = parent->right->data;

        operationsTmp[op] = parentIndex;
        
        // printf("op %02d dest %02d c1 %02d c2 %02d\n",
        //        op, parentIndex, child1Index, child2Index);

        bool newLaunch = false;

        if (op == 0) {
            newLaunch = true;
        } else if (child1Index >= parentMinIndex || child2Index >= parentMinIndex) {
            for (int i=gridStartOp[launchCount-1]; i < op; i++) {
                int previousParentIndex = operationsTmp[i];
                if (child1Index == previousParentIndex || child2Index == previousParentIndex) {
                    newLaunch = true;
                    break;
                }
            }
        }

       if (newLaunch) {
            gridStartOp[launchCount] = op;
            parentMinIndex = parentIndex;

            launchCount++;
        } 

        if (parentIndex < parentMinIndex)
            parentMinIndex = parentIndex;
    }

    return launchCount;
}